

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_edge_tec(REF_GEOM ref_geom,REF_INT edgeid,char *filename)

{
  uint uVar1;
  FILE *__stream;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  FILE *file;
  REF_DBL xyz [3];
  double local_58;
  REF_DBL trange [2];
  REF_DBL s1;
  REF_DBL s0;
  REF_DBL t;
  REF_INT n;
  REF_INT i;
  char *filename_local;
  REF_GEOM pRStack_18;
  REF_INT edgeid_local;
  REF_GEOM ref_geom_local;
  
  t._0_4_ = 0x3e9;
  _n = filename;
  filename_local._4_4_ = edgeid;
  pRStack_18 = ref_geom;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",_n);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x11ac,
           "ref_geom_edge_tec","unable to open file");
    ref_geom_local._4_4_ = 2;
  }
  else {
    fprintf(__stream,"title=\"refine edge\"\n");
    fprintf(__stream,"variables = \"x\" \"y\" \"z\" \"t\"\n");
    uVar1 = ref_egads_edge_trange(pRStack_18,filename_local._4_4_,&local_58);
    if (uVar1 == 0) {
      fprintf(__stream,"zone t=\"edge%d\", i=%d, datapacking=%s\n",(ulong)filename_local._4_4_,
              (ulong)t._0_4_,"point");
      for (t._4_4_ = 0; t._4_4_ < (int)t._0_4_; t._4_4_ = t._4_4_ + 1) {
        trange[1] = (double)t._4_4_ / (double)(int)(t._0_4_ - 1);
        s0 = (1.0 - trange[1]) * local_58 + trange[1] * trange[0];
        uVar1 = ref_egads_eval_at(pRStack_18,1,filename_local._4_4_,&s0,(REF_DBL *)&file,
                                  (REF_DBL *)0x0);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x11b9,"ref_geom_edge_tec",(ulong)uVar1,"eval edge");
          return uVar1;
        }
        fprintf(__stream,"%f %f %f %f\n",file,xyz[0],xyz[1],s0);
      }
      fclose(__stream);
      ref_geom_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x11b1
             ,"ref_geom_edge_tec",(ulong)uVar1,"trange");
      ref_geom_local._4_4_ = uVar1;
    }
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_edge_tec(REF_GEOM ref_geom, REF_INT edgeid,
                                     const char *filename) {
  REF_INT i, n = 1001;
  REF_DBL t, s0, s1;
  REF_DBL trange[2], xyz[3];
  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine edge\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\" \"t\"\n");

  RSS(ref_egads_edge_trange(ref_geom, edgeid, trange), "trange");
  fprintf(file, "zone t=\"edge%d\", i=%d, datapacking=%s\n", edgeid, n,
          "point");
  for (i = 0; i < n; i++) {
    s1 = ((REF_DBL)i) / ((REF_DBL)(n - 1));
    s0 = 1.0 - s1;
    t = s0 * trange[0] + s1 * trange[1];
    RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, edgeid, &t, xyz, NULL),
        "eval edge");
    fprintf(file, "%f %f %f %f\n", xyz[0], xyz[1], xyz[2], t);
  }
  fclose(file);
  return REF_SUCCESS;
}